

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

void __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::pop
          (iterator *this)

{
  ulong uVar1;
  stack_entry *psVar2;
  ulong uVar3;
  
  if ((this->stack_).c.
      super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->stack_).c.
      super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x1dd,
                  "void unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::pop() [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  psVar2 = top(this);
  uVar3 = (ulong)(psVar2->super_iter_result).prefix.f.key_prefix_length;
  uVar1 = (this->keybuf_).off;
  if (uVar3 <= uVar1) {
    (this->keybuf_).off = uVar1 - uVar3;
    std::
    deque<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
    ::pop_back(&(this->stack_).c);
    return;
  }
  __assert_fail("off >= n",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                ,0x1d8,"void unodb::detail::key_buffer::pop(size_t)");
}

Assistant:

void pop() noexcept {
      UNODB_DETAIL_ASSERT(!empty());

      // Note: We DO NOT need to check the RCS here. The prefix_len
      // on the stack is known to be valid at the time that the entry
      // was pushed onto the stack and the stack and the keybuf are in
      // sync with one another.  So we can just do a simple POP for
      // each of them.
      const auto prefix_len = top().prefix.length();
      keybuf_.pop(prefix_len);
      stack_.pop();
    }